

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

void Aig_ManPartitionPrint(Aig_Man_t *p,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  uint i;
  int iVar4;
  
  i = 0;
  iVar4 = 0;
  do {
    if (vPartSuppsAll->nSize <= (int)i) break;
    pvVar2 = Vec_PtrEntry(vPartSuppsAll,i);
    pvVar3 = Vec_PtrEntry(vPartsAll,i);
    uVar1 = *(uint *)((long)pvVar3 + 4);
    printf("%d=(%d,%d) ",(ulong)i,(ulong)*(uint *)((long)pvVar2 + 4),(ulong)uVar1);
    iVar4 = iVar4 + uVar1;
    i = i + 1;
  } while (i != vPartsAll->nSize);
  if (iVar4 == p->nObjs[3]) {
    return;
  }
  __assert_fail("Counter == Aig_ManCoNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                ,599,"void Aig_ManPartitionPrint(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Aig_ManPartitionPrint( Aig_Man_t * p, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll )
{
    Vec_Int_t * vOne;
    int i, nOutputs, Counter;

    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        nOutputs = Vec_IntSize((Vec_Int_t *)Vec_PtrEntry(vPartsAll, i));
        printf( "%d=(%d,%d) ", i, Vec_IntSize(vOne), nOutputs );
        Counter += nOutputs;
        if ( i == Vec_PtrSize(vPartsAll) - 1 )
            break;
    }
    assert( Counter == Aig_ManCoNum(p) );
//    printf( "\nTotal = %d. Outputs = %d.\n", Counter, Aig_ManCoNum(p) );
}